

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2pt.hxx
# Opt level: O0

void P2Pt::multm3x3<float>(float (*m1) [3] [3],float (*m2) [3] [3],float (*output_m) [3])

{
  uint k;
  uint j;
  uint i;
  float (*output_m_local) [3];
  float (*m2_local) [3] [3];
  float (*m1_local) [3] [3];
  
  for (i = 0; i < 3; i = i + 1) {
    for (j = 0; j < 3; j = j + 1) {
      output_m[i][j] = 0.0;
      for (k = 0; k < 3; k = k + 1) {
        output_m[i][j] = (*m1)[i][k] * (*m2)[k][j] + output_m[i][j];
      }
    }
  }
  return;
}

Assistant:

inline void
multm3x3(const T (&m1)[3][3], const T (&m2)[3][3], T output_m[][3])
{
	for (unsigned i = 0; i < 3; i++)
		for (unsigned j = 0; j < 3; j++) {
			output_m[i][j] = 0;
			for (unsigned k = 0; k < 3; k++)
				output_m[i][j] += m1[i][k] * m2[k][j];
		}
}